

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageSizeTests.cpp
# Opt level: O0

void __thiscall
vkt::image::anon_unknown_0::SizeTestInstance::SizeTestInstance
          (SizeTestInstance *this,Context *context,Texture *texture,VkFormat format)

{
  PtrData<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_> data;
  Allocator *allocator_00;
  Allocator *device_00;
  VkDevice vk_00;
  Buffer *this_00;
  Buffer *in_stack_fffffffffffffef8;
  DefaultDeleter<vkt::image::Buffer> local_ad;
  deUint32 local_ac;
  VkBufferCreateInfo local_a8;
  PtrData<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_> local_70;
  PtrData<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_> *local_60;
  Allocator *local_50;
  Allocator *allocator;
  VkDevice device;
  DeviceInterface *vk;
  VkFormat local_24;
  Texture *pTStack_20;
  VkFormat format_local;
  Texture *texture_local;
  Context *context_local;
  SizeTestInstance *this_local;
  
  local_24 = format;
  pTStack_20 = texture;
  texture_local = (Texture *)context;
  context_local = (Context *)this;
  TestInstance::TestInstance(&this->super_TestInstance,context);
  (this->super_TestInstance)._vptr_TestInstance = (_func_int **)&PTR__SizeTestInstance_0166c3a8;
  Texture::Texture(&this->m_texture,pTStack_20);
  this->m_format = local_24;
  this->m_resultBufferSizeBytes = 0xc;
  de::details::MovePtr<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>::MovePtr
            (&this->m_resultBuffer);
  device = (VkDevice)Context::getDeviceInterface((this->super_TestInstance).m_context);
  allocator = (Allocator *)Context::getDevice((this->super_TestInstance).m_context);
  local_50 = Context::getDefaultAllocator((this->super_TestInstance).m_context);
  this_00 = (Buffer *)operator_new(0x30);
  vk_00 = device;
  device_00 = allocator;
  allocator_00 = local_50;
  makeBufferCreateInfo(&local_a8,this->m_resultBufferSizeBytes,0x20);
  local_ac = ::vk::MemoryRequirement::HostVisible.m_flags;
  image::Buffer::Buffer
            (this_00,(DeviceInterface *)vk_00,(VkDevice)device_00,allocator_00,&local_a8,
             ::vk::MemoryRequirement::HostVisible);
  de::DefaultDeleter<vkt::image::Buffer>::DefaultDeleter(&local_ad);
  de::details::MovePtr<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>::MovePtr
            ((MovePtr<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_> *)&local_70);
  local_60 = de::details::MovePtr::operator_cast_to_PtrData(&local_70,(MovePtr *)this_00);
  data._8_8_ = local_60;
  data.ptr = in_stack_fffffffffffffef8;
  de::details::MovePtr<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>::operator=
            (&this->m_resultBuffer,data);
  de::details::MovePtr<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>::~MovePtr
            ((MovePtr<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_> *)&local_70);
  return;
}

Assistant:

SizeTestInstance::SizeTestInstance (Context& context, const Texture& texture, const VkFormat format)
	: TestInstance				(context)
	, m_texture					(texture)
	, m_format					(format)
	, m_resultBufferSizeBytes	(3 * sizeof(deUint32))	// ivec3 in shader
{
	const DeviceInterface&	vk			= m_context.getDeviceInterface();
	const VkDevice			device		= m_context.getDevice();
	Allocator&				allocator	= m_context.getDefaultAllocator();

	// Create an SSBO for shader output.

	m_resultBuffer = de::MovePtr<Buffer>(new Buffer(
		vk, device, allocator,
		makeBufferCreateInfo(m_resultBufferSizeBytes, VK_BUFFER_USAGE_STORAGE_BUFFER_BIT),
		MemoryRequirement::HostVisible));
}